

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.hpp
# Opt level: O1

void __thiscall EOClient::EOClient(EOClient *this,Socket *sock,EOServer *server_)

{
  Client::Client(&this->super_Client,sock,&server_->super_Server);
  (this->super_Client)._vptr_Client = (_func_int **)&PTR_NeedTick_001d3538;
  (this->send_buffer2)._M_dataplus._M_p = (pointer)&(this->send_buffer2).field_2;
  (this->send_buffer2)._M_string_length = 0;
  (this->send_buffer2).field_2._M_local_buf[0] = '\0';
  this->start = 0.0;
  this->next_eif_id = 1;
  this->next_enf_id = 1;
  this->next_esf_id = 1;
  this->next_ecf_id = 1;
  (this->queue).queue.c.
  super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue).queue.c.
  super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->queue).queue.c.
  super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->queue).queue.c.
  super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->queue).queue.c.
           super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                       *)&this->queue,0);
  (this->queue).next = 0.0;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  PacketProcessor::PacketProcessor(&this->processor);
  Initialize(this);
  return;
}

Assistant:

EOClient(const Socket &sock, EOServer *server_) : Client(sock, server_)
		{
			this->Initialize();
		}